

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::pointer_writer<unsigned_long>&>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,
          pointer_writer<unsigned_long> *f)

{
  undefined2 *__s;
  byte bVar1;
  uint uVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  char *pcVar7;
  buffer<char> *c;
  size_t __n;
  uint uVar8;
  unsigned_long uVar9;
  undefined2 *puVar10;
  long lVar11;
  char __tmp;
  size_t size;
  size_t __len_1;
  ulong uVar12;
  bool bVar13;
  
  uVar2 = specs->width;
  uVar8 = f->num_digits + 2;
  puVar3 = *(undefined8 **)this;
  lVar4 = puVar3[2];
  if (uVar8 < uVar2) {
    uVar12 = (ulong)uVar2 + lVar4;
    if ((ulong)puVar3[3] < uVar12) {
      (**(code **)*puVar3)(puVar3,uVar12);
    }
    puVar3[2] = uVar12;
    lVar5 = puVar3[1];
    __s = (undefined2 *)(lVar5 + lVar4);
    bVar1 = (specs->fill).data_[0];
    __n = (ulong)uVar2 - (ulong)uVar8;
    bVar6 = specs->field_0x9 & 0xf;
    if (bVar6 == 3) {
      uVar12 = __n >> 1;
      puVar10 = __s;
      if (1 < __n) {
        puVar10 = (undefined2 *)((long)__s + uVar12);
        memset(__s,(uint)bVar1,uVar12);
      }
      *puVar10 = 0x7830;
      lVar11 = (long)puVar10 + (long)f->num_digits;
      pcVar7 = (char *)((long)puVar10 + (long)f->num_digits + 1);
      uVar9 = f->value;
      do {
        *pcVar7 = "0123456789abcdef"[(uint)uVar9 & 0xf];
        pcVar7 = pcVar7 + -1;
        bVar13 = 0xf < uVar9;
        uVar9 = uVar9 >> 4;
      } while (bVar13);
      if (uVar2 != uVar8) {
        __n = __n - uVar12;
LAB_00189fac:
        memset((void *)(lVar11 + 2),(uint)bVar1,__n);
        return;
      }
    }
    else if (bVar6 == 2) {
      puVar10 = __s;
      if (uVar2 != uVar8) {
        puVar10 = (undefined2 *)((long)__s + __n);
        memset(__s,(uint)bVar1,__n);
      }
      *puVar10 = 0x7830;
      pcVar7 = (char *)((long)puVar10 + (long)f->num_digits + 1);
      uVar9 = f->value;
      do {
        *pcVar7 = "0123456789abcdef"[(uint)uVar9 & 0xf];
        pcVar7 = pcVar7 + -1;
        bVar13 = 0xf < uVar9;
        uVar9 = uVar9 >> 4;
      } while (bVar13);
    }
    else {
      *(undefined2 *)(lVar5 + lVar4) = 0x7830;
      lVar11 = (long)__s + (long)f->num_digits;
      pcVar7 = (char *)(lVar5 + lVar4 + f->num_digits + 1);
      uVar9 = f->value;
      do {
        *pcVar7 = "0123456789abcdef"[(uint)uVar9 & 0xf];
        pcVar7 = pcVar7 + -1;
        bVar13 = 0xf < uVar9;
        uVar9 = uVar9 >> 4;
      } while (bVar13);
      if (uVar2 != uVar8) goto LAB_00189fac;
    }
  }
  else {
    uVar12 = lVar4 + (ulong)uVar8;
    if ((ulong)puVar3[3] < uVar12) {
      (**(code **)*puVar3)(puVar3,uVar12);
    }
    puVar3[2] = uVar12;
    lVar5 = puVar3[1];
    *(undefined2 *)(lVar5 + lVar4) = 0x7830;
    pcVar7 = (char *)(lVar5 + f->num_digits + lVar4 + 1);
    uVar9 = f->value;
    do {
      *pcVar7 = "0123456789abcdef"[(uint)uVar9 & 0xf];
      pcVar7 = pcVar7 + -1;
      bVar13 = 0xf < uVar9;
      uVar9 = uVar9 >> 4;
    } while (bVar13);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }